

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O0

int __thiscall
CRegexSearcherSimple::compile_and_match
          (CRegexSearcherSimple *this,char *patstr,size_t patlen,char *entirestr,char *searchstr,
          size_t searchlen)

{
  re_status_t rVar1;
  int in_ECX;
  long in_RDI;
  int in_R8D;
  int m;
  short loop_vars [20];
  re_compiled_pattern_base pat;
  re_compiled_pattern_base *in_stack_00000118;
  size_t in_stack_00000120;
  char *in_stack_00000128;
  size_t in_stack_00000130;
  char *in_stack_00000138;
  CRegexSearcher *in_stack_00000140;
  re_tuple_conflict *in_stack_00000160;
  re_machine *in_stack_00000168;
  re_group_register_conflict *in_stack_00000170;
  short *in_stack_00000178;
  re_compiled_pattern_base *in_stack_000002d0;
  size_t in_stack_000002d8;
  char *in_stack_000002e0;
  CRegexParser *in_stack_000002e8;
  undefined4 local_4c;
  undefined4 local_c;
  
  *(undefined4 *)(in_RDI + 0x7c) = 0;
  clear_group_regs((CRegexSearcherSimple *)0x386f1e);
  rVar1 = CRegexParser::compile
                    (in_stack_000002e8,in_stack_000002e0,in_stack_000002d8,in_stack_000002d0);
  if (rVar1 == RE_STATUS_SUCCESS) {
    *(undefined4 *)(in_RDI + 0x7c) = local_4c;
    local_c = CRegexSearcher::match
                        (in_stack_00000140,in_stack_00000138,in_stack_00000130,in_stack_00000128,
                         in_stack_00000120,in_stack_00000118,in_stack_00000160,in_stack_00000168,
                         in_stack_00000170,in_stack_00000178);
    if (-1 < local_c) {
      *(int *)(in_RDI + 0x74) = in_R8D - in_ECX;
      *(int *)(in_RDI + 0x78) = *(int *)(in_RDI + 0x74) + local_c;
    }
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

int CRegexSearcherSimple::compile_and_match(
    const char *patstr, size_t patlen,
    const char *entirestr, const char *searchstr, size_t searchlen)
{
    re_compiled_pattern_base pat;
    short loop_vars[RE_LOOP_VARS_MAX];

    /* no groups yet */
    group_cnt_ = 0;

    /* clear the group registers */
    clear_group_regs();

    /* compile the expression - return failure if we get an error */
    if (parser_->compile(patstr, patlen, &pat) != RE_STATUS_SUCCESS)
        return FALSE;

    /* remember the group count from the compiled pattern */
    group_cnt_ = pat.group_cnt;

    /* match the string */
    int m = match(entirestr, searchlen + (searchstr - entirestr),
                  searchstr, searchlen,
                  &pat, parser_->tuple_arr_, &pat.machine, regs_, loop_vars);

    /* save the match information on success */
    if (m >= 0)
    {
        match_.start_ofs = searchstr - entirestr;
        match_.end_ofs = match_.start_ofs + m;
    }

    /* return the result */
    return m;
}